

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O0

size_t __thiscall bssl::SSLAEADContext::MaxSealInputLen(SSLAEADContext *this,size_t max_out)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  evp_aead_ctx_st *ctx;
  EVP_AEAD *aead;
  SSL_CIPHER *pSVar5;
  SSLAEADContext *local_50;
  ulong local_38;
  size_t block_size;
  size_t overhead;
  size_t explicit_nonce_len;
  size_t max_out_local;
  SSLAEADContext *this_local;
  
  sVar4 = ExplicitNonceLen(this);
  if (sVar4 < max_out) {
    explicit_nonce_len = max_out - sVar4;
    bVar2 = is_null_cipher(this);
    this_local = (SSLAEADContext *)explicit_nonce_len;
    if ((!bVar2) && (iVar3 = CRYPTO_fuzzer_mode_enabled(), iVar3 == 0)) {
      ctx = internal::
            StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::get
                      (&this->ctx_);
      aead = EVP_AEAD_CTX_aead(ctx);
      block_size = EVP_AEAD_max_overhead(aead);
      pSVar5 = cipher(this);
      iVar3 = SSL_CIPHER_is_block_cipher(pSVar5);
      if (iVar3 != 0) {
        pSVar5 = cipher(this);
        uVar1 = pSVar5->algorithm_enc;
        if (uVar1 == 1) {
          local_38 = 8;
        }
        else {
          if ((uVar1 != 2) && (uVar1 != 4)) {
            abort();
          }
          local_38 = 0x10;
        }
        explicit_nonce_len = (local_38 - 1 ^ 0xffffffffffffffff) & explicit_nonce_len;
        if (block_size <= local_38) {
          __assert_fail("overhead > block_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                        ,0xc9,"size_t bssl::SSLAEADContext::MaxSealInputLen(size_t) const");
        }
        block_size = block_size - (local_38 - 1);
      }
      if (block_size < explicit_nonce_len) {
        local_50 = (SSLAEADContext *)(explicit_nonce_len - block_size);
      }
      else {
        local_50 = (SSLAEADContext *)0x0;
      }
      this_local = local_50;
    }
  }
  else {
    this_local = (SSLAEADContext *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t SSLAEADContext::MaxSealInputLen(size_t max_out) const {
  size_t explicit_nonce_len = ExplicitNonceLen();
  if (max_out <= explicit_nonce_len) {
    return 0;
  }
  max_out -= explicit_nonce_len;
  if (is_null_cipher() || CRYPTO_fuzzer_mode_enabled()) {
    return max_out;
  }
  // TODO(crbug.com/42290602): This should be part of |EVP_AEAD_CTX|.
  size_t overhead = EVP_AEAD_max_overhead(EVP_AEAD_CTX_aead(ctx_.get()));
  if (SSL_CIPHER_is_block_cipher(cipher())) {
    size_t block_size;
    switch (cipher()->algorithm_enc) {
      case SSL_AES128:
      case SSL_AES256:
        block_size = 16;
        break;
      case SSL_3DES:
        block_size = 8;
        break;
      default:
        abort();
    }

    // The output for a CBC cipher is always a whole number of blocks. Round the
    // remaining capacity down.
    max_out &= ~(block_size - 1);
    // The maximum overhead is a full block of padding and the MAC, but the
    // minimum overhead is one byte of padding, once we know the output is
    // rounded down.
    assert(overhead > block_size);
    overhead -= block_size - 1;
  }
  return max_out <= overhead ? 0 : max_out - overhead;
}